

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays_test_generated.h
# Opt level: O0

void __thiscall
MyGame::Example::ArrayStruct::ArrayStruct
          (ArrayStruct *this,float _a,span<const_int,_15UL> *_b,int8_t _c,
          span<const_MyGame::Example::NestedStruct,_2UL> *_d,int32_t _e,span<const_long,_2UL> *_f)

{
  char cVar1;
  int iVar2;
  Array<int,_(unsigned_short)15> *this_00;
  Array<MyGame::Example::NestedStruct,_(unsigned_short)2> *this_01;
  Array<long,_(unsigned_short)2> *this_02;
  float fVar3;
  NestedStruct *local_78;
  span<const_long,_2UL> local_70;
  span<const_MyGame::Example::NestedStruct,_2UL> local_60;
  span<const_int,_15UL> local_50;
  span<const_long,_2UL> *local_40;
  span<const_long,_2UL> *_f_local;
  span<const_MyGame::Example::NestedStruct,_2UL> *psStack_30;
  int32_t _e_local;
  span<const_MyGame::Example::NestedStruct,_2UL> *_d_local;
  span<const_int,_15UL> *psStack_20;
  int8_t _c_local;
  span<const_int,_15UL> *_b_local;
  ArrayStruct *pAStack_10;
  float _a_local;
  ArrayStruct *this_local;
  
  local_40 = _f;
  _f_local._4_4_ = _e;
  psStack_30 = _d;
  _d_local._7_1_ = _c;
  psStack_20 = _b;
  _b_local._4_4_ = _a;
  pAStack_10 = this;
  fVar3 = flatbuffers::EndianScalar<float>(_a);
  this->a_ = fVar3;
  cVar1 = flatbuffers::EndianScalar<signed_char>(_d_local._7_1_);
  this->c_ = cVar1;
  this->padding0__ = '\0';
  this->padding1__ = 0;
  this->padding2__ = 0;
  local_78 = this->d_;
  do {
    NestedStruct::NestedStruct(local_78);
    local_78 = local_78 + 1;
  } while (local_78 != (NestedStruct *)&this->e_);
  iVar2 = flatbuffers::EndianScalar<int>(_f_local._4_4_);
  this->e_ = iVar2;
  this->padding3__ = 0;
  this_00 = flatbuffers::CastToArray<int,(unsigned_short)15>((int (*) [15])this->b_);
  flatbuffers::span<const_int,_15UL>::span(&local_50,_b);
  flatbuffers::Array<int,_(unsigned_short)15>::CopyFromSpan(this_00,&local_50);
  this_01 = flatbuffers::CastToArray<MyGame::Example::NestedStruct,(unsigned_short)2>(&this->d_);
  flatbuffers::span<const_MyGame::Example::NestedStruct,_2UL>::span(&local_60,_d);
  flatbuffers::Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::CopyFromSpan
            (this_01,&local_60);
  this_02 = flatbuffers::CastToArray<long,(unsigned_short)2>((long (*) [2])this->f_);
  flatbuffers::span<const_long,_2UL>::span(&local_70,_f);
  flatbuffers::Array<long,_(unsigned_short)2>::CopyFromSpan(this_02,&local_70);
  return;
}

Assistant:

ArrayStruct(float _a, ::flatbuffers::span<const int32_t, 15> _b, int8_t _c, ::flatbuffers::span<const MyGame::Example::NestedStruct, 2> _d, int32_t _e, ::flatbuffers::span<const int64_t, 2> _f)
      : a_(::flatbuffers::EndianScalar(_a)),
        c_(::flatbuffers::EndianScalar(_c)),
        padding0__(0),
        padding1__(0),
        padding2__(0),
        e_(::flatbuffers::EndianScalar(_e)),
        padding3__(0) {
    ::flatbuffers::CastToArray(b_).CopyFromSpan(_b);
    (void)padding0__;
    (void)padding1__;
    (void)padding2__;
    ::flatbuffers::CastToArray(d_).CopyFromSpan(_d);
    (void)padding3__;
    ::flatbuffers::CastToArray(f_).CopyFromSpan(_f);
  }